

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

ostream * absl::lts_20250127::operator<<(ostream *os,StatusCode code)

{
  ostream *poVar1;
  StatusCode in_EDX;
  undefined4 in_register_00000034;
  string local_30;
  
  StatusCodeToString_abi_cxx11_
            (&local_30,(lts_20250127 *)CONCAT44(in_register_00000034,code),in_EDX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, StatusCode code) {
  return os << StatusCodeToString(code);
}